

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmidl.c
# Opt level: O3

_Bool tmidl_parser_parse(tmidl_parser_o *parser,char *input,tmidl_callbacks_i *callbacks,
                        void *user_context)

{
  int *piVar1;
  undefined8 *puVar2;
  int iVar3;
  size_t sVar4;
  tmidl_function_t **pptVar5;
  tmidl_function_t *ptVar6;
  char *pcVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  tmidl_diagnostic_t diagnostic;
  mpc_result_t r;
  tmidl_declaration_t local_88;
  int local_5c;
  void *local_58;
  tmidl_callbacks_i *local_50;
  long local_48;
  mpc_result_t local_40;
  long local_38;
  
  local_5c = mpc_parse("input",input,parser->module_parser,&local_40);
  if (local_5c == 0) {
    pcVar7 = mpc_err_string(local_40.error);
    local_88.type = TMIDL_ITEM_INTERFACE;
    iVar3 = (int)((local_40.error)->state).pos;
    local_88.doc = (char *)CONCAT44(iVar3 + 1,iVar3);
    local_88.name = pcVar7;
    (*callbacks->on_diagnostic)((tmidl_diagnostic_t *)&local_88,user_context);
    free(pcVar7);
    mpc_err_delete(local_40.error);
  }
  else {
    if (0 < (int)((local_40.error)->state).row) {
      lVar11 = ((local_40.error)->state).pos;
      lVar8 = 0;
      local_58 = user_context;
      local_50 = callbacks;
      local_48 = lVar11;
      do {
        piVar1 = *(int **)(lVar11 + lVar8 * 8);
        if (*piVar1 == 1) {
          (*callbacks->on_module_doc)(*(char **)(piVar1 + 2),user_context);
        }
        else if (*piVar1 == 0) {
          puVar2 = *(undefined8 **)(piVar1 + 2);
          piVar1 = (int *)puVar2[2];
          if (*piVar1 == 1) {
            local_38 = *(long *)(piVar1 + 6);
            if (*(int *)(puVar2 + 1) != 1) {
              local_88.type = TMIDL_ITEM_OPAQUE;
              local_88.name = "Top level structure declaration must have a typedef storage class.";
              local_88.doc = (char *)puVar2[4];
              (*callbacks->on_diagnostic)((tmidl_diagnostic_t *)&local_88,user_context);
            }
            if ((char *)puVar2[3] != (char *)0x0) {
              pcVar7 = *(char **)(piVar1 + 2);
              iVar3 = strcmp((char *)puVar2[3],pcVar7);
              if (iVar3 != 0) {
                iVar3 = piVar1[4];
                local_88.type = TMIDL_ITEM_OPAQUE;
                local_88.name = "The type specifier name must be the same as the declarator.";
                local_88.doc = (char *)CONCAT44(local_88.doc._4_4_,iVar3);
                sVar4 = strlen(pcVar7);
                local_88.doc = (char *)CONCAT44((int)sVar4 + iVar3,local_88.doc._0_4_);
                (*local_50->on_diagnostic)((tmidl_diagnostic_t *)&local_88,local_58);
              }
            }
            local_88.type = (tmidl_declaration_type_t)(local_38 != 0);
            local_88.name = *(char **)(piVar1 + 2);
            local_88.doc = (char *)*puVar2;
            local_88.functions = (tmidl_function_t **)0x0;
            local_88.functions_count = 0;
            if (local_38 != 0) {
              uVar10 = (ulong)(int)(*(long **)(piVar1 + 6))[1];
              lVar11 = **(long **)(piVar1 + 6);
              local_88.functions_count = uVar10;
              pptVar5 = (tmidl_function_t **)malloc(uVar10 * 8);
              local_88.functions = pptVar5;
              if (uVar10 != 0) {
                uVar9 = 0;
                do {
                  ptVar6 = (tmidl_function_t *)malloc(8);
                  pptVar5[uVar9] = ptVar6;
                  ptVar6->name = *(char **)(*(long *)(lVar11 + uVar9 * 8) + 0x18);
                  uVar9 = uVar9 + 1;
                } while (uVar10 != uVar9);
              }
            }
            callbacks = local_50;
            user_context = local_58;
            (*local_50->on_declaration)(&local_88,local_58);
            lVar11 = local_48;
            if (local_88.functions != (tmidl_function_t **)0x0) {
              if (local_88.functions_count != 0) {
                uVar10 = 0;
                do {
                  free(local_88.functions[uVar10]);
                  uVar10 = uVar10 + 1;
                } while (uVar10 < local_88.functions_count);
              }
              free(local_88.functions);
            }
          }
          else {
            lVar11 = local_48;
            if (*piVar1 == 0) {
              local_88.type = TMIDL_ITEM_OPAQUE;
              local_88.name = "Only structure declarations are allowed at the top level.";
              local_88.doc = (char *)puVar2[4];
              (*callbacks->on_diagnostic)((tmidl_diagnostic_t *)&local_88,user_context);
            }
          }
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < (int)((local_40.error)->state).row);
    }
    free_items(local_40.output);
  }
  return local_5c != 0;
}

Assistant:

bool tmidl_parser_parse(
    tmidl_parser_o *parser,
    const char *input,
    const tmidl_callbacks_i *callbacks,
    void *user_context)
{
    // Parse the input
    mpc_result_t r;
    bool success = mpc_parse("input", input, parser->module_parser, &r);

    if (!success) {
        char *message = mpc_err_string(r.error);

        tmidl_diagnostic_t diagnostic;
        diagnostic.level = TMIDL_LEVEL_ERROR;
        diagnostic.message = message;
        diagnostic.position_start = r.error->state.pos;
        diagnostic.position_end = r.error->state.pos + 1;
        callbacks->on_diagnostic(&diagnostic, user_context);

        free(message);
        mpc_err_delete(r.error);
        return false;
    }

    // Pass items to caller
    util_array_t *array = r.output;
    c_item_t **items = array->ptr;

    for (int i = 0; i < array->count; i++) {
        c_item_t *item = items[i];

        switch (item->type) {
        case C_ITEM_TYPE_DECLARATION:
            handle_declaration(((c_item_declaration_t *)item)->declaration, callbacks, user_context);
            break;
        case C_ITEM_TYPE_MODULE_DOC:
            callbacks->on_module_doc(((c_item_module_doc_t *)item)->doc, user_context);
            break;
        }
    }

    // Clean up the parsed items
    free_items(array);

    return true;
}